

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_solvers_3x3::test_method(test_solvers_3x3 *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  local_80;
  unsigned_long uStack_58;
  size_t expected_assignment [3];
  int aiStack_38 [2];
  int costs [9];
  test_solvers_3x3 *this_local;
  
  costs[2] = 2;
  costs[3] = -1;
  costs[4] = 3;
  costs[5] = 0;
  aiStack_38[0] = 1;
  aiStack_38[1] = 2;
  costs[0] = 4;
  costs[1] = 0;
  costs[6] = -3;
  uStack_58 = 1;
  expected_assignment[0] = 0;
  expected_assignment[1] = 2;
  unique0x10000159 = this;
  make_matrix<int>(&local_80,aiStack_38,3,3);
  make_vector<unsigned_long>(&local_98,&uStack_58,3);
  assert_solvers_result<int>(&local_80,-1,&local_98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_98);
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::~matrix(&local_80);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_3x3)
{
  const int costs[] = {1, 2, 4,
                       0, 2, -1,
                       3, 0, -3};
  const std::size_t expected_assignment[] = {1, 0, 2};
  assert_solvers_result(make_matrix(costs, 3, 3), -1, make_vector(expected_assignment, 3));
}